

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O1

void __thiscall
draco::PointAttributeVectorOutputIterator<float>::PointAttributeVectorOutputIterator
          (PointAttributeVectorOutputIterator<float> *this,
          vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
          *atts)

{
  pointer ptVar1;
  _Head_base<3UL,_unsigned_int,_false> *p_Var2;
  long lVar3;
  uint uVar4;
  ulong __new_size;
  ulong uVar5;
  
  (this->memory_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
  ::vector(&this->attributes_,atts);
  (this->point_id_).value_ = 0;
  ptVar1 = (this->attributes_).
           super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __new_size = 0;
  lVar3 = (long)(this->attributes_).
                super__Vector_base<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    p_Var2 = (_Head_base<3UL,_unsigned_int,_false> *)
             ((long)&(ptVar1->
                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                     ).
                     super__Tuple_impl<1UL,_unsigned_int,_draco::DataType,_unsigned_int,_unsigned_int>
                     .super__Tuple_impl<2UL,_draco::DataType,_unsigned_int,_unsigned_int> + 4);
    uVar5 = __new_size;
    do {
      uVar4 = (((_Tuple_impl<3UL,_unsigned_int,_unsigned_int> *)(p_Var2 + -1))->
              super__Tuple_impl<4UL,_unsigned_int>).super__Head_base<4UL,_unsigned_int,_false>.
              _M_head_impl * p_Var2->_M_head_impl;
      __new_size = (ulong)uVar4;
      if (uVar4 < (uint)uVar5) {
        __new_size = uVar5;
      }
      p_Var2 = p_Var2 + 6;
      lVar3 = lVar3 + -1;
      uVar5 = __new_size;
    } while (lVar3 != 0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->memory_,__new_size);
  this->data_ = (this->memory_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

explicit PointAttributeVectorOutputIterator(
      const std::vector<AttributeTuple> &atts)
      : attributes_(atts), point_id_(0) {
    DRACO_DCHECK_GE(atts.size(), 1);
    uint32_t required_decode_bytes = 0;
    for (auto index = 0; index < attributes_.size(); index++) {
      const AttributeTuple &att = attributes_[index];
      required_decode_bytes = (std::max)(required_decode_bytes,
                                         std::get<3>(att) * std::get<4>(att));
    }
    memory_.resize(required_decode_bytes);
    data_ = memory_.data();
  }